

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_3::collectNamedStructureDefinitions
               (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *dst,
               VarType *type)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  StructType *pSVar4;
  char *name;
  StructMember *this;
  VarType *pVVar5;
  StructType *local_50;
  int local_44;
  iterator iStack_40;
  int ndx;
  StructNameEqualPredicate local_38;
  __normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
  local_30;
  __normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
  local_28;
  __normal_iterator<const_glu::StructType_**,_std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>_>
  local_20;
  iterator where;
  VarType *type_local;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *dst_local;
  
  where._M_current = (StructType **)type;
  bVar2 = glu::VarType::isBasicType(type);
  if (!bVar2) {
    bVar2 = glu::VarType::isArrayType((VarType *)where._M_current);
    if (bVar2) {
      pVVar5 = glu::VarType::getElementType((VarType *)where._M_current);
      collectNamedStructureDefinitions(dst,pVVar5);
    }
    else {
      bVar2 = glu::VarType::isStructType((VarType *)where._M_current);
      if (bVar2) {
        pSVar4 = glu::VarType::getStructPtr((VarType *)where._M_current);
        bVar2 = glu::StructType::hasTypeName(pSVar4);
        if (bVar2) {
          local_28._M_current =
               (StructType **)
               std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::begin
                         (dst);
          local_30._M_current =
               (StructType **)
               std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::end
                         (dst);
          pSVar4 = glu::VarType::getStructPtr((VarType *)where._M_current);
          name = glu::StructType::getTypeName(pSVar4);
          StructNameEqualPredicate::StructNameEqualPredicate(&local_38,name);
          local_20 = std::
                     find_if<__gnu_cxx::__normal_iterator<glu::StructType_const**,std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>>,deqp::gles31::Functional::(anonymous_namespace)::StructNameEqualPredicate>
                               (local_28,local_30,local_38);
          iStack_40 = std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                      ::end(dst);
          bVar2 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffc0);
          if (bVar2) {
            return;
          }
        }
        local_44 = 0;
        while( true ) {
          iVar1 = local_44;
          pSVar4 = glu::VarType::getStructPtr((VarType *)where._M_current);
          iVar3 = glu::StructType::getNumMembers(pSVar4);
          if (iVar3 <= iVar1) break;
          pSVar4 = glu::VarType::getStructPtr((VarType *)where._M_current);
          this = glu::StructType::getMember(pSVar4,local_44);
          pVVar5 = glu::StructMember::getType(this);
          collectNamedStructureDefinitions(dst,pVVar5);
          local_44 = local_44 + 1;
        }
        local_50 = glu::VarType::getStructPtr((VarType *)where._M_current);
        std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
                  (dst,&local_50);
      }
    }
  }
  return;
}

Assistant:

static void collectNamedStructureDefinitions (std::vector<const glu::StructType*>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
		return;
	else if (type.isArrayType())
		return collectNamedStructureDefinitions(dst, type.getElementType());
	else if (type.isStructType())
	{
		if (type.getStructPtr()->hasTypeName())
		{
			// must be unique (may share the the same struct)
			std::vector<const glu::StructType*>::iterator where = std::find_if(dst.begin(), dst.end(), StructNameEqualPredicate(type.getStructPtr()->getTypeName()));
			if (where != dst.end())
			{
				DE_ASSERT(**where == *type.getStructPtr());

				// identical type has been added already, types of members must be added too
				return;
			}
		}

		// Add types of members first
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			collectNamedStructureDefinitions(dst, type.getStructPtr()->getMember(ndx).getType());

		dst.push_back(type.getStructPtr());
	}
	else
		DE_ASSERT(false);
}